

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::UpdateStats
               (BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *state,
               idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  uint64_t uVar2;
  bool bVar3;
  pointer pCVar4;
  uhugeint_t *puVar5;
  uhugeint_t *puVar6;
  uhugeint_t local_48;
  
  this = &state->current_segment;
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    puVar5 = (uhugeint_t *)&(pCVar4->stats).statistics.stats_union.numeric_data.min;
    puVar6 = (uhugeint_t *)&(pCVar4->stats).statistics.stats_union.numeric_data.max;
    local_48.lower = (state->state).maximum.lower;
    local_48.upper = (state->state).maximum.upper;
    bVar3 = uhugeint_t::operator>(puVar5,&local_48);
    if (bVar3) {
      puVar5 = &local_48;
    }
    uVar2 = puVar5->upper;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 8) = puVar5->lower;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x10) = uVar2;
    bVar3 = uhugeint_t::operator>(&local_48,puVar6);
    if (bVar3) {
      puVar6 = &local_48;
    }
    uVar2 = puVar6->upper;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x18) = puVar6->lower;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x20) = uVar2;
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    puVar6 = (uhugeint_t *)&(pCVar4->stats).statistics.stats_union.numeric_data.min;
    puVar5 = (uhugeint_t *)&(pCVar4->stats).statistics.stats_union.numeric_data.max;
    local_48.lower = (state->state).minimum.lower;
    local_48.upper = (state->state).minimum.upper;
    bVar3 = uhugeint_t::operator>(puVar6,&local_48);
    if (bVar3) {
      puVar6 = &local_48;
    }
    uVar2 = puVar6->upper;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 8) = puVar6->lower;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x10) = uVar2;
    bVar3 = uhugeint_t::operator>(&local_48,puVar5);
    if (bVar3) {
      puVar5 = &local_48;
    }
    uVar2 = puVar5->upper;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x18) = puVar5->lower;
    *(uint64_t *)((long)&(pCVar4->stats).statistics.stats_union + 0x20) = uVar2;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}